

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::CharSet<char16_t>::ToComplement
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *result)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  ulong uVar7;
  size_t sVar8;
  Char lc;
  uint index;
  
  if ((this->rep).compact.countPlusOne - 1 < 5) {
    Sort(this);
    uVar7 = (this->rep).compact.countPlusOne;
    if (4 < uVar7 - 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x1ef,"(IsCompact())","IsCompact()");
      if (!bVar3) goto LAB_00e5c583;
      *puVar6 = 0;
      uVar7 = (this->rep).compact.countPlusOne;
    }
    if ((int)uVar7 != 1) {
      index = 0;
      uVar4 = GetCompactCharU(this,0);
      if (uVar4 != 0) {
        uVar4 = GetCompactCharU(this,0);
        if (0xffff < uVar4 - 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                             ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
          if (!bVar3) goto LAB_00e5c583;
          *puVar6 = 0;
        }
        SetRange(result,allocator,L'\0',(Char)(uVar4 - 1));
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      while( true ) {
        sVar8 = (this->rep).compact.countPlusOne;
        if (4 < sVar8 - 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x1ef,"(IsCompact())","IsCompact()");
          if (!bVar3) goto LAB_00e5c583;
          *puVar6 = 0;
          sVar8 = (this->rep).compact.countPlusOne;
        }
        uVar4 = (int)sVar8 - 2;
        if (uVar4 <= index) break;
        uVar4 = GetCompactCharU(this,index);
        if (0xffff < uVar4 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                             ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
          if (!bVar3) goto LAB_00e5c583;
          *puVar6 = 0;
        }
        index = index + 1;
        uVar5 = GetCompactCharU(this,index);
        if (0xffff < uVar5 - 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                             ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
          if (!bVar3) goto LAB_00e5c583;
          *puVar6 = 0;
        }
        SetRange(result,allocator,(Char)(uVar4 + 1),(Char)(uVar5 - 1));
      }
      if (4 < sVar8 - 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x1ef,"(IsCompact())","IsCompact()");
        if (!bVar3) goto LAB_00e5c583;
        *puVar6 = 0;
        uVar4 = *(int *)&this->rep - 2;
      }
      uVar4 = GetCompactCharU(this,uVar4);
      if (0xfffe < uVar4) {
        return;
      }
      sVar8 = (this->rep).compact.countPlusOne;
      if (4 < sVar8 - 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x1ef,"(IsCompact())","IsCompact()");
        if (!bVar3) goto LAB_00e5c583;
        *puVar6 = 0;
        sVar8 = (this->rep).compact.countPlusOne;
      }
      uVar4 = GetCompactCharU(this,(int)sVar8 - 2);
      if (0xffff < uVar4 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                           ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
        if (!bVar3) goto LAB_00e5c583;
        *puVar6 = 0;
      }
      lc = (Char)(uVar4 + 1);
      goto LAB_00e5c56b;
    }
    if (4 < uVar7 - 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x1ef,"(IsCompact())","IsCompact()");
      if (!bVar3) {
LAB_00e5c583:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
      uVar7 = (ulong)*(uint *)&this->rep;
    }
    if ((int)uVar7 != 1) {
      return;
    }
    lc = L'\0';
  }
  else {
    CharBitvec::ToComplement<char16_t>(&(this->rep).full.direct,allocator,0,result);
    pCVar1 = (this->rep).full.root;
    if (pCVar1 != (CharSetNode *)0x0) {
      (*pCVar1->_vptr_CharSetNode[6])(pCVar1,allocator,2,0,result);
      return;
    }
    lc = L'Ā';
  }
LAB_00e5c56b:
  SetRange(result,allocator,lc,L'\xffff');
  return;
}

Assistant:

void CharSet<char16>::ToComplement(ArenaAllocator* allocator, CharSet<Char>& result)
    {
        if (IsCompact())
        {
            Sort();
            if (this->GetCompactLength() > 0)
            {
                if (this->GetCompactCharU(0) > 0)
                    result.SetRange(allocator, UTC(0), UTC(this->GetCompactCharU(0) - 1));
                for (uint i = 0; i < this->GetCompactLength() - 1; i++)
                {
                    result.SetRange(allocator, UTC(this->GetCompactCharU(i) + 1), UTC(this->GetCompactCharU(i + 1) - 1));
                }
                if (this->GetCompactCharU(this->GetCompactLength() - 1) < MaxUChar)
                {
                    result.SetRange(allocator, UTC(this->GetCompactCharU(this->GetCompactLength() - 1) + 1), UTC(MaxUChar));
                }
            }
            else if (this->GetCompactLength() == 0)
            {
                result.SetRange(allocator, UTC(0), UTC(MaxUChar));
            }
        }
        else
        {
            rep.full.direct.ToComplement<char16>(allocator, 0, result);
            if (rep.full.root == nullptr)
                result.SetRange(allocator, UTC(CharSetNode::directSize), MaxChar);
            else
                rep.full.root->ToComplement(allocator, CharSetNode::levels - 1, 0, result);
        }
    }